

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.cpp
# Opt level: O2

void __thiscall
Lista::Lista(Lista *this,string *nume,string *data,ReadingTracker *rt,MoodTracker *md)

{
  this->_vptr_Lista = (_func_int **)&PTR__Lista_0010dbe0;
  std::__cxx11::string::string((string *)&this->nume,nume);
  std::__cxx11::string::string((string *)&this->data,data);
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Taskuri).super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ReadingTracker::ReadingTracker(&this->rt,rt);
  MoodTracker::MoodTracker(&this->md,md);
  return;
}

Assistant:

Lista::Lista(const std::string &nume, const std::string &data, ReadingTracker &rt, MoodTracker &md) : nume(nume), data(data), rt(rt), md(md){}